

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_ddd_open_list.hpp
# Opt level: O3

void __thiscall
astar_ddd::AstarDDDOpenList<Node<Tiles>_>::AstarDDDOpenList
          (AstarDDDOpenList<Node<Tiles>_> *this,bool reopen_closed)

{
  named_fstream *pnVar1;
  named_fstream *pnVar2;
  int bucket_index;
  allocator_type local_43;
  allocator_type local_42;
  allocator_type local_41;
  named_fstream *local_40;
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  *local_38;
  
  this->n_buckets = 10;
  this->reopen_closed = reopen_closed;
  this->min_f = 0;
  this->next_f = 0x7fffffff;
  this->first_insert = true;
  this->current_bucket = 0;
  local_38 = &this->open_buckets;
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::vector(local_38,10,&local_41);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::vector(&this->next_buckets,(long)this->n_buckets,&local_42);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::vector(&this->closed_buckets,(long)this->n_buckets,&local_43);
  (this->recursive_bucket)._M_t.
  super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
  super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
  super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = (named_fstream *)0x0;
  TabulationHash<Node<Tiles>_>::TabulationHash(&this->bucket_hasher);
  TabulationHash<Node<Tiles>_>::TabulationHash(&this->dd_hasher);
  this->max_bucket_size_in_bytes = 0;
  mkdir("open_list_buckets",0x1e4);
  memory::make_unique<named_fstream,char_const(&)[35]>
            ((memory *)&local_40,(char (*) [35])"open_list_buckets/recursive.bucket");
  pnVar2 = local_40;
  local_40 = (named_fstream *)0x0;
  pnVar1 = (this->recursive_bucket)._M_t.
           super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
           super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
           super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
  (this->recursive_bucket)._M_t.
  super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
  super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
  super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = pnVar2;
  if (pnVar1 != (named_fstream *)0x0) {
    (**(code **)(*(long *)pnVar1 + 8))();
    if (local_40 != (named_fstream *)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
  }
  if (0 < this->n_buckets) {
    bucket_index = 0;
    do {
      create_bucket(this,bucket_index,open);
      create_bucket(this,bucket_index,next);
      create_bucket(this,bucket_index,closed);
      bucket_index = bucket_index + 1;
    } while (bucket_index < this->n_buckets);
  }
  dfpair(_stdout,"number of hash buckets","%d");
  return;
}

Assistant:

AstarDDDOpenList<Entry>::AstarDDDOpenList(bool reopen_closed) :
        reopen_closed(reopen_closed),
        open_buckets(n_buckets),
        next_buckets(n_buckets),
        closed_buckets(n_buckets)
    {
        // create directory for open list files if not exist
        mkdir("open_list_buckets", 0744);
        
        recursive_bucket = memory::make_unique<named_fstream>
            ("open_list_buckets/recursive.bucket");

        // create buckets
        for (int i = 0; i < n_buckets; ++i) {
            create_bucket(i, BucketType::open);
            create_bucket(i, BucketType::next);
            create_bucket(i, BucketType::closed);
        }
        dfpair(stdout, "number of hash buckets", "%d", n_buckets);
    }